

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

MatcherDescriberInterface *
testing::internal::MatcherBase<void*>::
GetDescriberImpl<testing::internal::MatcherBase<void*>::ValuePolicy<testing::internal::EqMatcher<void*>,true>>
          (MatcherBase<void_*> *m)

{
  __tuple_element_t<0UL,_tuple<const_MatcherBase<void_*>_*,_const_EqMatcher<void_*>_*>_> *ppMVar1;
  MatcherBase<void_*> *local_28;
  tuple<const_testing::internal::MatcherBase<void_*>_*,_const_testing::internal::EqMatcher<void_*>_*>
  local_20;
  MatcherBase<void_*> *local_10;
  MatcherBase<void_*> *m_local;
  
  local_28 = m;
  local_10 = m;
  MatcherBase<void_*>::ValuePolicy<testing::internal::EqMatcher<void_*>,_true>::Get(m);
  std::
  make_tuple<testing::internal::MatcherBase<void*>const*,testing::internal::EqMatcher<void*>const*>
            ((MatcherBase<void_*> **)&local_20,(EqMatcher<void_*> **)&local_28);
  ppMVar1 = std::
            get<0ul,testing::internal::MatcherBase<void*>const*,testing::internal::EqMatcher<void*>const*>
                      (&local_20);
  return &(*ppMVar1)->super_MatcherDescriberInterface;
}

Assistant:

static const MatcherDescriberInterface* GetDescriberImpl(
      const MatcherBase& m) {
    // If the impl is a MatcherDescriberInterface, then return it.
    // Otherwise use MatcherBase itself.
    // This allows us to implement the GetDescriber() function without support
    // from the impl, but some users really want to get their impl back when
    // they call GetDescriber().
    // We use std::get on a tuple as a workaround of not having `if constexpr`.
    return std::get<(
        std::is_convertible<decltype(&P::Get(m)),
                            const MatcherDescriberInterface*>::value
            ? 1
            : 0)>(std::make_tuple(&m, &P::Get(m)));
  }